

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_options(archive_read *a,char *key,char *val)

{
  int iVar1;
  archive_string_conv *paVar2;
  archive *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  wchar_t ret;
  lha *lha;
  char *charset;
  wchar_t local_4;
  
  local_4 = L'\xffffffe7';
  charset = *(char **)in_RDI[0x15].archive_format_name;
  iVar1 = strcmp(in_RSI,"hdrcharset");
  if (iVar1 == 0) {
    if ((in_RDX == (archive *)0x0) || ((char)in_RDX->magic == '\0')) {
      archive_set_error(in_RDI,-1,"lha: hdrcharset option needs a character-set name");
    }
    else {
      paVar2 = archive_string_conversion_from_charset(in_RDX,charset,local_4);
      *(archive_string_conv **)(charset + 0xd0) = paVar2;
      if (*(long *)(charset + 0xd0) == 0) {
        local_4 = L'\xffffffe2';
      }
      else {
        local_4 = L'\0';
      }
    }
  }
  else {
    local_4 = L'\xffffffec';
  }
  return local_4;
}

Assistant:

static int
archive_read_format_lha_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct lha *lha;
	int ret = ARCHIVE_FAILED;

	lha = (struct lha *)(a->format->data);
	if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lha: hdrcharset option needs a character-set name");
		else {
			lha->opt_sconv =
			    archive_string_conversion_from_charset(
				&a->archive, val, 0);
			if (lha->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}